

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZWavyLine>::TPZGeoElRefLess(TPZGeoElRefLess<pzgeom::TPZWavyLine> *this)

{
  long lVar1;
  
  (this->super_TPZGeoEl).fMesh = (TPZGeoMesh *)0x0;
  (this->super_TPZGeoEl).fId = -1;
  (this->super_TPZGeoEl).fMatId = 0;
  (this->super_TPZGeoEl).fReference = (TPZCompEl *)0x0;
  *(undefined4 *)&(this->super_TPZGeoEl).fFatherIndex = 0xffffffff;
  *(undefined4 *)((long)&(this->super_TPZGeoEl).fFatherIndex + 4) = 0xffffffff;
  *(undefined4 *)&(this->super_TPZGeoEl).fIndex = 0xffffffff;
  *(undefined4 *)((long)&(this->super_TPZGeoEl).fIndex + 4) = 0xffffffff;
  (this->super_TPZGeoEl).fNumInterfaces = 0;
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018c1340;
  *(undefined4 *)
   (this->fGeo).super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->fGeo).super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes + 4)
       = 0xffffffff;
  *(undefined4 *)
   ((this->fGeo).super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes + 1) =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->fGeo).super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes +
   0xc) = 0xffffffff;
  (this->fGeo).super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZWavyLine_018d3dc8;
  (this->fGeo).fNumWaves = 0;
  TPZManVector<double,_3>::TPZManVector(&(this->fGeo).fWaveDir,0);
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x48);
  lVar1 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x48);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}